

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HPresolve.cpp
# Opt level: O0

Result __thiscall
presolve::HPresolve::aggregator(HPresolve *this,HighsPostsolveStack *postsolve_stack)

{
  int iVar1;
  int iVar2;
  anon_class_8_1_8991fb9c comp;
  __normal_iterator<std::pair<int,_int>_*,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>
  __last;
  const_iterator __last_00;
  __normal_iterator<std::pair<int,_int>_*,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>
  begin;
  const_iterator __last_01;
  __normal_iterator<std::pair<int,_int>_*,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>
  __first;
  const_iterator __first_00;
  const_iterator __first_01;
  byte bVar3;
  bool bVar4;
  HighsInt HVar5;
  Result RVar6;
  HPresolve *pHVar7;
  reference pvVar8;
  reference pvVar9;
  reference pvVar10;
  reference pvVar11;
  reference pvVar12;
  reference this_00;
  char *pcVar13;
  iterator this_01;
  iterator iVar14;
  int __c;
  int __c_00;
  iterator *rhs;
  long *in_RDI;
  HighsInt in_stack_00000024;
  HPresolve *in_stack_00000028;
  Result __result_3;
  Result __result_2;
  HighsSliceNonzero *nz;
  iterator __end2;
  iterator __begin2;
  HighsTripletListSlice *__range2;
  HighsInt fillin;
  double maxVal;
  Result __result_1;
  Result __result;
  bool impliedIntegral;
  HighsInt nzPos;
  HighsInt col;
  HighsInt row;
  size_t i;
  HighsInt nfail;
  bool logging_on;
  vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> *in_stack_fffffffffffffe48;
  vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> *this_02;
  undefined4 in_stack_fffffffffffffe50;
  value_type in_stack_fffffffffffffe54;
  double in_stack_fffffffffffffe58;
  double dVar15;
  undefined4 in_stack_fffffffffffffe60;
  value_type in_stack_fffffffffffffe64;
  __normal_iterator<std::pair<int,_int>_*,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>
  in_stack_fffffffffffffe68;
  value_type in_stack_fffffffffffffe70;
  int in_stack_fffffffffffffe74;
  undefined4 in_stack_fffffffffffffe78;
  value_type in_stack_fffffffffffffe7c;
  HPresolve *this_03;
  HighsInt in_stack_fffffffffffffeac;
  HPresolveAnalysis *in_stack_fffffffffffffeb0;
  undefined8 in_stack_fffffffffffffeb8;
  undefined8 in_stack_fffffffffffffec0;
  HighsPostsolveStack *in_stack_fffffffffffffec8;
  HPresolve *in_stack_fffffffffffffed0;
  uint in_stack_fffffffffffffed8;
  Result in_stack_fffffffffffffedc;
  iterator local_118;
  iterator local_f8;
  HighsTimer *in_stack_ffffffffffffff38;
  HighsInt in_stack_ffffffffffffff44;
  HPresolve *in_stack_ffffffffffffff48;
  undefined4 in_stack_ffffffffffffff50;
  int in_stack_ffffffffffffff54;
  HPresolve *local_88;
  int local_7c;
  
  bVar3 = *(byte *)((long)in_RDI + 0x691) & 1;
  if (bVar3 != 0) {
    HPresolveAnalysis::startPresolveRuleLog(in_stack_fffffffffffffeb0,in_stack_fffffffffffffeac);
  }
  std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::begin
            (in_stack_fffffffffffffe48);
  std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::end
            (in_stack_fffffffffffffe48);
  __first._M_current._4_4_ = in_stack_fffffffffffffe7c;
  __first._M_current._0_4_ = in_stack_fffffffffffffe78;
  __last._M_current._4_4_ = in_stack_fffffffffffffe74;
  __last._M_current._0_4_ = in_stack_fffffffffffffe70;
  std::
  remove_if<__gnu_cxx::__normal_iterator<std::pair<int,int>*,std::vector<std::pair<int,int>,std::allocator<std::pair<int,int>>>>,presolve::HPresolve::aggregator(presolve::HighsPostsolveStack&)::__0>
            (__first,__last,
             (anon_class_8_1_8991fb9c_for__M_pred)in_stack_fffffffffffffe68._M_current);
  __gnu_cxx::
  __normal_iterator<std::pair<int,int>const*,std::vector<std::pair<int,int>,std::allocator<std::pair<int,int>>>>
  ::__normal_iterator<std::pair<int,int>*>
            ((__normal_iterator<const_std::pair<int,_int>_*,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>
              *)CONCAT44(in_stack_fffffffffffffe54,in_stack_fffffffffffffe50),
             (__normal_iterator<std::pair<int,_int>_*,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>
              *)in_stack_fffffffffffffe48);
  std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::end
            (in_stack_fffffffffffffe48);
  __gnu_cxx::
  __normal_iterator<std::pair<int,int>const*,std::vector<std::pair<int,int>,std::allocator<std::pair<int,int>>>>
  ::__normal_iterator<std::pair<int,int>*>
            ((__normal_iterator<const_std::pair<int,_int>_*,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>
              *)CONCAT44(in_stack_fffffffffffffe54,in_stack_fffffffffffffe50),
             (__normal_iterator<std::pair<int,_int>_*,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>
              *)in_stack_fffffffffffffe48);
  __first_00._M_current._4_4_ = in_stack_fffffffffffffe7c;
  __first_00._M_current._0_4_ = in_stack_fffffffffffffe78;
  __last_00._M_current._4_4_ = in_stack_fffffffffffffe74;
  __last_00._M_current._0_4_ = in_stack_fffffffffffffe70;
  std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::erase
            ((vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> *)
             in_stack_fffffffffffffe68._M_current,__first_00,__last_00);
  std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::begin
            (in_stack_fffffffffffffe48);
  std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::end
            (in_stack_fffffffffffffe48);
  begin._M_current._4_4_ = in_stack_fffffffffffffe74;
  begin._M_current._0_4_ = in_stack_fffffffffffffe70;
  comp.this._4_4_ = in_stack_fffffffffffffe64;
  comp.this._0_4_ = in_stack_fffffffffffffe60;
  pdqsort<__gnu_cxx::__normal_iterator<std::pair<int,int>*,std::vector<std::pair<int,int>,std::allocator<std::pair<int,int>>>>,presolve::HPresolve::aggregator(presolve::HighsPostsolveStack&)::__1>
            (begin,in_stack_fffffffffffffe68,comp);
  local_7c = 0;
  local_88 = (HPresolve *)0x0;
  while (this_03 = local_88,
        pHVar7 = (HPresolve *)
                 std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::size
                           ((vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> *)
                            (in_RDI + 0x9e)), this_03 < pHVar7) {
    pvVar8 = std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::operator[]
                       ((vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> *)
                        (in_RDI + 0x9e),(size_type)local_88);
    iVar1 = pvVar8->first;
    pvVar8 = std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::operator[]
                       ((vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> *)
                        (in_RDI + 0x9e),(size_type)local_88);
    iVar2 = pvVar8->second;
    pvVar9 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                       ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)(in_RDI + 0xb9),
                        (long)iVar1);
    if ((((*pvVar9 == '\0') &&
         (pvVar9 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                             ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                              (in_RDI + 0xbc),(long)iVar2), *pvVar9 == '\0')) &&
        (bVar4 = isImpliedFree((HPresolve *)
                               CONCAT44(in_stack_fffffffffffffe54,in_stack_fffffffffffffe50),
                               (HighsInt)((ulong)in_stack_fffffffffffffe48 >> 0x20)), bVar4)) &&
       (bVar4 = isDualImpliedFree((HPresolve *)
                                  CONCAT44(in_stack_fffffffffffffe64,in_stack_fffffffffffffe60),
                                  (HighsInt)((ulong)in_stack_fffffffffffffe58 >> 0x20)), bVar4)) {
      HVar5 = findNonzero((HPresolve *)CONCAT44(in_stack_fffffffffffffe7c,in_stack_fffffffffffffe78)
                          ,in_stack_fffffffffffffe74,in_stack_fffffffffffffe70);
      if (HVar5 == -1) {
        pvVar8 = std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::operator[]
                           ((vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> *)
                            (in_RDI + 0x9e),(size_type)local_88);
        pvVar8->first = -1;
      }
      else {
        pvVar10 = std::vector<HighsVarType,_std::allocator<HighsVarType>_>::operator[]
                            ((vector<HighsVarType,_std::allocator<HighsVarType>_> *)
                             (*in_RDI + 0x178),(long)iVar2);
        if (*pvVar10 == kInteger) {
          pvVar11 = std::vector<int,_std::allocator<int>_>::operator[]
                              ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x23),(long)iVar1);
          in_stack_fffffffffffffe7c = *pvVar11;
          pvVar11 = std::vector<int,_std::allocator<int>_>::operator[]
                              ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x20),(long)iVar1);
          if (in_stack_fffffffffffffe7c == *pvVar11) {
            in_stack_fffffffffffffe74 = iVar1;
            std::vector<double,_std::allocator<double>_>::operator[]
                      ((vector<double,_std::allocator<double>_> *)(in_RDI + 5),(long)HVar5);
            bVar4 = rowCoefficientsIntegral
                              (in_stack_ffffffffffffff48,in_stack_ffffffffffffff44,
                               (double)in_stack_ffffffffffffff38);
            in_stack_fffffffffffffe78 = CONCAT13(1,(int3)in_stack_fffffffffffffe78);
            if (!bVar4) goto LAB_007090d0;
          }
          else {
LAB_007090d0:
            bVar4 = isImpliedIntegral(in_stack_00000028,in_stack_00000024);
            in_stack_fffffffffffffe78 = CONCAT13(bVar4,(int3)in_stack_fffffffffffffe78);
          }
          if ((char)((uint)in_stack_fffffffffffffe78 >> 0x18) == '\0') goto LAB_0070961f;
        }
        pvVar11 = std::vector<int,_std::allocator<int>_>::operator[]
                            ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x20),(long)iVar1);
        if ((*pvVar11 == 2) ||
           (pvVar11 = std::vector<int,_std::allocator<int>_>::operator[]
                                ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x29),(long)iVar2),
           *pvVar11 == 2)) {
          storeRow((HPresolve *)CONCAT44(in_stack_fffffffffffffe54,in_stack_fffffffffffffe50),
                   (HighsInt)((ulong)in_stack_fffffffffffffe48 >> 0x20));
          substituteFreeCol(in_stack_fffffffffffffed0,in_stack_fffffffffffffec8,
                            (HighsInt)((ulong)in_stack_fffffffffffffec0 >> 0x20),
                            (HighsInt)in_stack_fffffffffffffec0,
                            SUB81((ulong)in_stack_fffffffffffffeb8 >> 0x38,0));
          pvVar8 = std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::
                   operator[]((vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> *)
                              (in_RDI + 0x9e),(size_type)local_88);
          pvVar8->first = -1;
          RVar6 = removeRowSingletons((HPresolve *)in_stack_fffffffffffffe68._M_current,
                                      (HighsPostsolveStack *)
                                      CONCAT44(in_stack_fffffffffffffe64,in_stack_fffffffffffffe60))
          ;
          if (RVar6 != kOk) {
            return RVar6;
          }
          RVar6 = checkLimits((HPresolve *)
                              CONCAT44(in_stack_fffffffffffffedc,in_stack_fffffffffffffed8),
                              (HighsPostsolveStack *)in_stack_fffffffffffffed0);
          if (RVar6 != kOk) {
            return RVar6;
          }
        }
        else {
          pvVar11 = std::vector<int,_std::allocator<int>_>::operator[]
                              ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x20),(long)iVar1);
          in_stack_fffffffffffffe70 = *pvVar11;
          pvVar11 = std::vector<int,_std::allocator<int>_>::operator[]
                              ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x29),(long)iVar2);
          if (in_stack_fffffffffffffe70 < *pvVar11) {
            pHVar7 = (HPresolve *)
                     getMaxAbsRowVal((HPresolve *)
                                     CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50),
                                     (HighsInt)((ulong)in_stack_ffffffffffffff48 >> 0x20));
          }
          else {
            pHVar7 = (HPresolve *)
                     getMaxAbsColVal(in_stack_fffffffffffffed0,
                                     (HighsInt)((ulong)in_stack_fffffffffffffec8 >> 0x20));
          }
          in_stack_fffffffffffffe68._M_current = (pair<int,_int> *)pHVar7;
          pvVar12 = std::vector<double,_std::allocator<double>_>::operator[]
                              ((vector<double,_std::allocator<double>_> *)(in_RDI + 5),(long)HVar5);
          if (ABS(*pvVar12) < (double)pHVar7 * *(double *)(in_RDI[1] + 0x290)) {
            pvVar11 = std::vector<int,_std::allocator<int>_>::operator[]
                                ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x20),(long)iVar1);
            in_stack_fffffffffffffe64 = *pvVar11;
            pvVar11 = std::vector<int,_std::allocator<int>_>::operator[]
                                ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x29),(long)iVar2);
            if (in_stack_fffffffffffffe64 < *pvVar11) {
              dVar15 = getMaxAbsColVal(in_stack_fffffffffffffed0,
                                       (HighsInt)((ulong)in_stack_fffffffffffffec8 >> 0x20));
            }
            else {
              dVar15 = getMaxAbsRowVal((HPresolve *)
                                       CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50)
                                       ,(HighsInt)((ulong)in_stack_ffffffffffffff48 >> 0x20));
            }
            in_stack_fffffffffffffe58 = dVar15;
            pvVar12 = std::vector<double,_std::allocator<double>_>::operator[]
                                ((vector<double,_std::allocator<double>_> *)(in_RDI + 5),(long)HVar5
                                );
            if (ABS(*pvVar12) < dVar15 * *(double *)(in_RDI[1] + 0x290)) {
              pvVar8 = std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::
                       operator[]((vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
                                   *)(in_RDI + 0x9e),(size_type)local_88);
              pvVar8->first = -1;
              goto LAB_0070961f;
            }
          }
          storeRow((HPresolve *)CONCAT44(in_stack_fffffffffffffe54,in_stack_fffffffffffffe50),
                   (HighsInt)((ulong)in_stack_fffffffffffffe48 >> 0x20));
          pvVar11 = std::vector<int,_std::allocator<int>_>::operator[]
                              ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x20),(long)iVar1);
          in_stack_fffffffffffffe54 = *pvVar11;
          pvVar11 = std::vector<int,_std::allocator<int>_>::operator[]
                              ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x29),(long)iVar2);
          in_stack_ffffffffffffff54 = -(in_stack_fffffffffffffe54 + *pvVar11 + -1);
          getColumnVector(this_03,in_stack_fffffffffffffe7c);
          in_stack_ffffffffffffff48 = (HPresolve *)&stack0xffffffffffffff28;
          HighsMatrixSlice<HighsTripletListSlice>::begin
                    ((HighsMatrixSlice<HighsTripletListSlice> *)
                     CONCAT44(in_stack_fffffffffffffe54,in_stack_fffffffffffffe50));
          HighsMatrixSlice<HighsTripletListSlice>::end
                    ((HighsMatrixSlice<HighsTripletListSlice> *)
                     CONCAT44(in_stack_fffffffffffffe54,in_stack_fffffffffffffe50));
          while( true ) {
            rhs = &local_118;
            bVar4 = HighsMatrixSlice<HighsTripletListSlice>::iterator::operator!=(&local_f8,rhs);
            if (!bVar4) break;
            this_00 = HighsMatrixSlice<HighsTripletListSlice>::iterator::operator*(&local_f8);
            pcVar13 = HighsSliceNonzero::index(this_00,(char *)rhs,__c);
            if ((int)pcVar13 != iVar1) {
              HighsSliceNonzero::index(this_00,(char *)rhs,__c_00);
              HVar5 = countFillin(this_03,in_stack_fffffffffffffe7c);
              in_stack_ffffffffffffff54 = HVar5 + in_stack_ffffffffffffff54;
              if (*(int *)(in_RDI[1] + 0x248) < in_stack_ffffffffffffff54) break;
            }
            HighsMatrixSlice<HighsTripletListSlice>::iterator::operator++(&local_f8);
          }
          if (*(int *)(in_RDI[1] + 0x248) < in_stack_ffffffffffffff54) {
            local_7c = local_7c + 1;
            if (local_7c == 3) break;
          }
          else {
            local_7c = 0;
            substituteFreeCol(in_stack_fffffffffffffed0,in_stack_fffffffffffffec8,
                              (HighsInt)((ulong)in_stack_fffffffffffffec0 >> 0x20),
                              (HighsInt)in_stack_fffffffffffffec0,
                              SUB81((ulong)in_stack_fffffffffffffeb8 >> 0x38,0));
            pvVar8 = std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::
                     operator[]((vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
                                 *)(in_RDI + 0x9e),(size_type)local_88);
            pvVar8->first = -1;
            in_stack_fffffffffffffedc =
                 removeRowSingletons((HPresolve *)in_stack_fffffffffffffe68._M_current,
                                     (HighsPostsolveStack *)
                                     CONCAT44(in_stack_fffffffffffffe64,in_stack_fffffffffffffe60));
            if (in_stack_fffffffffffffedc != kOk) {
              return in_stack_fffffffffffffedc;
            }
            RVar6 = checkLimits((HPresolve *)(ulong)in_stack_fffffffffffffed8,
                                (HighsPostsolveStack *)in_stack_fffffffffffffed0);
            if (RVar6 != kOk) {
              return RVar6;
            }
            in_stack_fffffffffffffed8 = 0;
          }
        }
      }
    }
    else {
      pvVar8 = std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::operator[]
                         ((vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> *)
                          (in_RDI + 0x9e),(size_type)local_88);
      pvVar8->first = -1;
    }
LAB_0070961f:
    local_88 = (HPresolve *)((long)&local_88->model + 1);
  }
  this_02 = (vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> *)(in_RDI + 0x9e);
  this_01 = std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::begin(this_02);
  iVar14 = std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::end(this_02);
  std::
  remove_if<__gnu_cxx::__normal_iterator<std::pair<int,int>*,std::vector<std::pair<int,int>,std::allocator<std::pair<int,int>>>>,presolve::HPresolve::aggregator(presolve::HighsPostsolveStack&)::__2>
            (this_01._M_current,iVar14._M_current);
  HVar5 = (HighsInt)((ulong)iVar14._M_current >> 0x20);
  __gnu_cxx::
  __normal_iterator<std::pair<int,int>const*,std::vector<std::pair<int,int>,std::allocator<std::pair<int,int>>>>
  ::__normal_iterator<std::pair<int,int>*>
            ((__normal_iterator<const_std::pair<int,_int>_*,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>
              *)CONCAT44(in_stack_fffffffffffffe54,in_stack_fffffffffffffe50),
             (__normal_iterator<std::pair<int,_int>_*,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>
              *)this_02);
  std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::end(this_02);
  __gnu_cxx::
  __normal_iterator<std::pair<int,int>const*,std::vector<std::pair<int,int>,std::allocator<std::pair<int,int>>>>
  ::__normal_iterator<std::pair<int,int>*>
            ((__normal_iterator<const_std::pair<int,_int>_*,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>
              *)CONCAT44(in_stack_fffffffffffffe54,in_stack_fffffffffffffe50),
             (__normal_iterator<std::pair<int,_int>_*,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>
              *)this_02);
  __first_01._M_current._4_4_ = in_stack_fffffffffffffe7c;
  __first_01._M_current._0_4_ = in_stack_fffffffffffffe78;
  __last_01._M_current._4_4_ = in_stack_fffffffffffffe74;
  __last_01._M_current._0_4_ = in_stack_fffffffffffffe70;
  std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::erase
            ((vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> *)
             in_stack_fffffffffffffe68._M_current,__first_01,__last_01);
  *(byte *)((long)in_RDI + 0x691) = bVar3;
  if (bVar3 != 0) {
    HPresolveAnalysis::stopPresolveRuleLog((HPresolveAnalysis *)this_01._M_current,HVar5);
  }
  return kOk;
}

Assistant:

HPresolve::Result HPresolve::aggregator(HighsPostsolveStack& postsolve_stack) {
  assert(analysis_.allow_rule_[kPresolveRuleAggregator]);
  const bool logging_on = analysis_.logging_on_;
  if (logging_on) analysis_.startPresolveRuleLog(kPresolveRuleAggregator);
  substitutionOpportunities.erase(
      std::remove_if(substitutionOpportunities.begin(),
                     substitutionOpportunities.end(),
                     [&](const std::pair<HighsInt, HighsInt>& p) {
                       HighsInt row = p.first;
                       HighsInt col = p.second;
                       return rowDeleted[row] || colDeleted[col] ||
                              !isImpliedFree(col) || !isDualImpliedFree(row);
                     }),
      substitutionOpportunities.end());

  pdqsort(
      substitutionOpportunities.begin(), substitutionOpportunities.end(),
      [&](const std::pair<HighsInt, HighsInt>& nz1,
          const std::pair<HighsInt, HighsInt>& nz2) {
        HighsInt minLen1 = std::min(rowsize[nz1.first], colsize[nz1.second]);
        HighsInt minLen2 = std::min(rowsize[nz2.first], colsize[nz2.second]);
        if (minLen1 == 2 && minLen2 != 2) return true;
        if (minLen2 == 2 && minLen1 != 2) return false;

        int64_t sizeProd1 = int64_t(rowsize[nz1.first]) * colsize[nz1.second];
        int64_t sizeProd2 = int64_t(rowsize[nz2.first]) * colsize[nz2.second];
        if (sizeProd1 < sizeProd2) return true;
        if (sizeProd2 < sizeProd1) return false;
        if (minLen1 < minLen2) return true;
        if (minLen2 < minLen1) return false;

        return std::make_tuple(HighsHashHelpers::hash(std::make_pair(
                                   uint32_t(nz1.first), uint32_t(nz1.second))),
                               nz1.first, nz1.second) <
               std::make_tuple(HighsHashHelpers::hash(std::make_pair(
                                   uint32_t(nz2.first), uint32_t(nz2.second))),
                               nz2.first, nz2.second);
      });

  HighsInt nfail = 0;
  for (size_t i = 0; i < substitutionOpportunities.size(); ++i) {
    HighsInt row = substitutionOpportunities[i].first;
    HighsInt col = substitutionOpportunities[i].second;

    if (rowDeleted[row] || colDeleted[col] || !isImpliedFree(col) ||
        !isDualImpliedFree(row)) {
      substitutionOpportunities[i].first = -1;
      continue;
    }

    HighsInt nzPos = findNonzero(row, col);
    if (nzPos == -1) {
      substitutionOpportunities[i].first = -1;
      continue;
    }
    if (model->integrality_[col] == HighsVarType::kInteger) {
      bool impliedIntegral =
          (rowsizeInteger[row] == rowsize[row] &&
           rowCoefficientsIntegral(row, 1.0 / Avalue[nzPos])) ||
          isImpliedIntegral(col);
      if (!impliedIntegral) continue;
    }

    // in the case where the row has length two or the column has length two
    // we always do the substitution since the fillin can never be problematic
    if (rowsize[row] == 2 || colsize[col] == 2) {
      storeRow(row);
      substituteFreeCol(postsolve_stack, row, col, true);
      substitutionOpportunities[i].first = -1;
      HPRESOLVE_CHECKED_CALL(removeRowSingletons(postsolve_stack));
      HPRESOLVE_CHECKED_CALL(checkLimits(postsolve_stack));
      continue;
    }

    double maxVal = rowsize[row] < colsize[col] ? getMaxAbsRowVal(row)
                                                : getMaxAbsColVal(col);
    if (std::fabs(Avalue[nzPos]) < maxVal * options->presolve_pivot_threshold) {
      maxVal = rowsize[row] < colsize[col] ? getMaxAbsColVal(col)
                                           : getMaxAbsRowVal(row);
      if (std::fabs(Avalue[nzPos]) <
          maxVal * options->presolve_pivot_threshold) {
        substitutionOpportunities[i].first = -1;
        continue;
      }
    }

    storeRow(row);
    HighsInt fillin = -(rowsize[row] + colsize[col] - 1);
    for (const auto& nz : getColumnVector(col)) {
      if (nz.index() == row) continue;
      fillin += countFillin(nz.index());

      if (fillin > options->presolve_substitution_maxfillin) break;
    }

    if (fillin > options->presolve_substitution_maxfillin) {
      ++nfail;
      // if the fill in is too much for multiple tries, then we stop
      // as this indicates that the rows/columns are becoming too dense
      // for substitutions
      if (nfail == 3) break;
      continue;
    }

    nfail = 0;
    substituteFreeCol(postsolve_stack, row, col, true);
    substitutionOpportunities[i].first = -1;
    HPRESOLVE_CHECKED_CALL(removeRowSingletons(postsolve_stack));
    HPRESOLVE_CHECKED_CALL(checkLimits(postsolve_stack));
  }

  substitutionOpportunities.erase(
      std::remove_if(
          substitutionOpportunities.begin(), substitutionOpportunities.end(),
          [](const std::pair<HighsInt, HighsInt>& p) { return p.first == -1; }),
      substitutionOpportunities.end());

  analysis_.logging_on_ = logging_on;
  if (logging_on) analysis_.stopPresolveRuleLog(kPresolveRuleAggregator);
  return Result::kOk;
}